

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O0

unsigned_long
kvtree_write_gather_map
          (char *prefix,char *file,unsigned_long offset,int level,int valid,MPI_Comm comm)

{
  unsigned_long uVar1;
  ssize_t sVar2;
  ssize_t write_rc;
  size_t bufsize;
  void *buf;
  int fd;
  mode_t mode;
  int newvalid;
  int newlevel;
  unsigned_long newoffset;
  char mappath [1024];
  char mapfile [1024];
  kvtree *save;
  kvtree *recv;
  kvtree *send;
  int allranks;
  int writer;
  unsigned_long pack_size;
  kvtree *hash;
  uint local_40;
  int ranks_world;
  int rank_world;
  int rc;
  MPI_Comm comm_local;
  int valid_local;
  int level_local;
  unsigned_long offset_local;
  char *file_local;
  char *prefix_local;
  
  ranks_world = 0;
  _rank_world = comm;
  comm_local._0_4_ = valid;
  comm_local._4_4_ = level;
  _valid_local = offset;
  offset_local = (unsigned_long)file;
  file_local = prefix;
  if (offset == 0) {
    MPI_Comm_rank(comm,&local_40);
    MPI_Comm_size(_rank_world,(long)&hash + 4);
    pack_size = (unsigned_long)kvtree_new();
    _allranks = 0;
    if ((int)comm_local != 0) {
      kvtree_util_set_str((kvtree *)pack_size,"FILE",(char *)offset_local);
      kvtree_util_set_bytecount((kvtree *)pack_size,"OFFSET",_valid_local);
      _allranks = kvtree_pack_size((kvtree *)pack_size);
    }
    pick_writer(comm_local._4_4_,_allranks,(int *)((long)&send + 4),(int *)&send,_rank_world);
    recv = kvtree_new();
    save = kvtree_new();
    if ((int)comm_local != 0) {
      kvtree_exchange_sendq(recv,send._4_4_,(kvtree *)pack_size);
    }
    kvtree_delete((kvtree **)&pack_size);
    kvtree_exchange_direction(recv,save,_rank_world,KVTREE_EXCHANGE_LEFT);
    mapfile._1016_8_ = kvtree_new();
    if (local_40 == send._4_4_) {
      kvtree_set((kvtree *)mapfile._1016_8_,"RANK",save);
      save = (kvtree *)0x0;
    }
    kvtree_delete(&save);
    kvtree_delete(&recv);
    if ((int)send == 0) {
      snprintf(mappath + 0x3f8,0x400,".%d.%d",(ulong)comm_local._4_4_,(ulong)send._4_4_);
    }
    else {
      snprintf(mappath + 0x3f8,0x400,"%s","");
    }
    snprintf((char *)&newoffset,0x400,"%s%s",file_local,mappath + 0x3f8);
    if ((int)send == 0) {
      _newvalid = 0;
      mode = comm_local._4_4_ + 1;
      fd = (int)(local_40 == send._4_4_);
      uVar1 = kvtree_write_gather_map(file_local,mappath + 0x3f8,0,mode,fd,_rank_world);
      if (uVar1 != 0) {
        ranks_world = 1;
      }
    }
    if (local_40 == send._4_4_) {
      buf._4_4_ = kvtree_getmode(1,1,0);
      buf._0_4_ = kvtree_open((char *)&newoffset,0x241,(ulong)buf._4_4_);
      if ((int)buf < 0) {
        kvtree_err("Opening file for write: %s @ %s:%d",&newoffset,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                   ,0xfc);
        ranks_world = 1;
      }
      else {
        kvtree_util_set_int((kvtree *)mapfile._1016_8_,"LEVEL",comm_local._4_4_);
        kvtree_util_set_int((kvtree *)mapfile._1016_8_,"RANKS",hash._4_4_);
        bufsize = 0;
        write_rc = 0;
        kvtree_write_persist((void **)&bufsize,(size_t *)&write_rc,(kvtree *)mapfile._1016_8_);
        kvtree_lseek((char *)&newoffset,(int)buf,_valid_local,0);
        sVar2 = kvtree_write_attempt((char *)&newoffset,(int)buf,(void *)bufsize,write_rc);
        if (sVar2 < 0) {
          ranks_world = 1;
        }
        kvtree_free(&bufsize);
        kvtree_close((char *)&newoffset,(int)buf);
      }
    }
    kvtree_delete((kvtree **)(mapfile + 0x3f8));
    prefix_local = (char *)(long)ranks_world;
  }
  else {
    kvtree_abort(1,"Attempt to write a non-zero offset (got %lu) for %s/%s @ %s:%d",offset,prefix,
                 file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0x8d);
    prefix_local = (char *)0x1;
  }
  return (unsigned_long)prefix_local;
}

Assistant:

static unsigned long kvtree_write_gather_map(
  const char* prefix,
  const char* file,
  unsigned long offset,
  int level,
  int valid,
  MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  if (offset != 0) {
    /*
     * While we technically can write to a non-zero offset, there were issues
     * with doing so with NFS, and so we disable it for now.  It will break
     * kvtree_read_scatter_single() if we enable it too.
     */
    kvtree_abort(1, "Attempt to write a non-zero offset (got %lu) for %s/%s @ %s:%d",
      offset, prefix, file, __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get name of this process */
  int rank_world, ranks_world;
  MPI_Comm_rank(comm, &rank_world);
  MPI_Comm_size(comm, &ranks_world);

  /* if this process will write a file, record file name and offset */
  kvtree* hash = kvtree_new();
  unsigned long pack_size = 0;
  if (valid) {
    kvtree_util_set_str(hash, "FILE", file);
    kvtree_util_set_bytecount(hash, "OFFSET", offset);
    pack_size = (unsigned long) kvtree_pack_size(hash);
  }

  /* pick writers so that we send roughly 1MB of data to each */
  int writer, allranks;
  pick_writer(level, pack_size, &writer, &allranks, comm);

  /* create new hashes to send and receive data */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* if we have valid values, queue it to send to writer */
  if (valid) {
    kvtree_exchange_sendq(send, writer, hash);
  }

  /* delete data hash */
  kvtree_delete(&hash);

  /* gather hash to writers */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_LEFT);

  /* we record incoming data in save hash for writing */
  kvtree* save = kvtree_new();
  if (rank_world == writer) {
    /* record hash containing file names indexed by rank,
     * attach received hash to save hash and set recv to NULL
     * since we no longer need to free it */
    kvtree_set(save, "RANK", recv);
    recv = NULL;
  }

  /* free send and receive hashes */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* define file name */
  char mapfile[1024];
  if (allranks) {
    /* at the top most level, simplify the name so we can find it */
    snprintf(mapfile, sizeof(mapfile), "%s", "");
  } else {
    /* for all lower level maps we append a level id and writer id */
    snprintf(mapfile, sizeof(mapfile), ".%d.%d", level, writer);
  }

  char mappath[1024];
  snprintf(mappath, sizeof(mappath), "%s%s", prefix, mapfile);

  /* call gather recursively if there's another level */
  if (! allranks) {
     /* gather file names to higher level */
     unsigned long newoffset = 0;
     int newlevel = level + 1;
     int newvalid = 0;
     if (rank_world == writer) {
       newvalid = 1;
     }
     if (kvtree_write_gather_map(prefix, mapfile, newoffset, newlevel, newvalid, comm) != KVTREE_SUCCESS)
     {
       rc = KVTREE_FAILURE;
     }
  }

  /* write hash to file */
  if (rank_world == writer) {
    /* open the file if we need to */
    mode_t mode = kvtree_getmode(1, 1, 0);
    int fd = kvtree_open(mappath, O_WRONLY | O_CREAT | O_TRUNC, mode);
    if (fd >= 0) {
      /* store level value in hash */
      kvtree_util_set_int(save, "LEVEL", level);

      /* record global number of ranks */
      kvtree_util_set_int(save, "RANKS", ranks_world);

      /* persist hash */
      void* buf = NULL;
      size_t bufsize = 0;
      kvtree_write_persist(&buf, &bufsize, save);

      /* write data to file */
      kvtree_lseek(mappath, fd, offset, SEEK_SET);
      ssize_t write_rc = kvtree_write_attempt(mappath, fd, buf, bufsize);
      if (write_rc < 0) {
        rc = KVTREE_FAILURE;
      }

      /* free the buffer holding the persistent hash */
      kvtree_free(&buf);

      /* close the file */
      kvtree_close(mappath, fd);
    } else {
      kvtree_err("Opening file for write: %s @ %s:%d",
        mappath, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* free the hash */
  kvtree_delete(&save);

  return rc;
}